

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O0

bool AnnounceKill(AActor *killer,AActor *killee)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *from;
  char *victim;
  ulong uVar4;
  char local_448 [8];
  char assembled [1024];
  bool local_3d;
  bool playSound;
  int rannum;
  char *message;
  SoundAndString *choice;
  char *killerName;
  AActor *killee_local;
  AActor *killer_local;
  
  uVar2 = FRandom::operator()(&pr_bbannounce);
  bVar1 = FBoolCVar::operator_cast_to_bool(&cl_bbannounce);
  if ((bVar1) && (iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 != 0)) {
    local_3d = AActor::CheckLocalView(killee,consoleplayer);
    if (killer == (AActor *)0x0) {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      if (iVar3 == 0) {
        uVar2 = (int)uVar2 % 3;
      }
      else {
        uVar2 = uVar2 & 1;
      }
      message = (char *)(WorldKillSounds + (int)uVar2);
      choice = (SoundAndString *)0x0;
    }
    else if (killer == killee) {
      message = (char *)(SuicideSounds + (int)(uVar2 & 3));
      choice = (SoundAndString *)userinfo_t::GetName(&killer->player->userinfo);
    }
    else {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      if (iVar3 == 0) {
        uVar4 = (ulong)(long)(int)uVar2 % 0x1f;
      }
      else {
        uVar4 = (ulong)(long)(int)uVar2 % 0x1e;
      }
      message = (char *)(KillSounds + uVar4);
      choice = (SoundAndString *)userinfo_t::GetName(&killer->player->userinfo);
      bVar1 = AActor::CheckLocalView(killer,consoleplayer);
      local_3d = local_3d || bVar1;
    }
    from = FStringTable::operator()(&GStrings,*(char **)message);
    if (from != (char *)0x0) {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      victim = userinfo_t::GetName(&killee->player->userinfo);
      SexMessage(from,local_448,iVar3,victim,(char *)choice);
      Printf(1,"%s\n",local_448);
    }
    if (local_3d != false) {
      DoVoiceAnnounce(*(char **)(message + 8));
    }
    killer_local._7_1_ = from != (char *)0x0;
  }
  else {
    killer_local._7_1_ = false;
  }
  return killer_local._7_1_;
}

Assistant:

bool AnnounceKill (AActor *killer, AActor *killee)
{
	const char *killerName;
	const SoundAndString *choice;
	const char *message;
	int rannum = pr_bbannounce();

	if (cl_bbannounce && deathmatch)
	{
		bool playSound = killee->CheckLocalView (consoleplayer);

		if (killer == NULL)
		{ // The world killed the player
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males have scrotums to separate
				choice = &WorldKillSounds[rannum % 3];
			}
			else
			{
				choice = &WorldKillSounds[rannum & 1];
			}
			killerName = NULL;
		}
		else if (killer == killee)
		{ // The player killed self
			choice = &SuicideSounds[rannum & 3];
			killerName = killer->player->userinfo.GetName();
		}
		else
		{ // Another player did the killing
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males can be castrated
				choice = &KillSounds[rannum % countof(KillSounds)];
			}
			else
			{
				choice = &KillSounds[rannum % (countof(KillSounds) - 1)];
			}
			killerName = killer->player->userinfo.GetName();

			// Blood only plays the announcement sound on the killer's
			// computer. I think it sounds neater to also hear it on
			// the killee's machine.
			playSound |= killer->CheckLocalView (consoleplayer);
		}

		message = GStrings(choice->Message);
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killerName);
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (playSound)
		{
			DoVoiceAnnounce (choice->Sound);
		}
		return message != NULL;
	}
	return false;
}